

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkcs5.c
# Opt level: O0

int mbedtls_pkcs5_pbes2(mbedtls_asn1_buf *pbe_params,int mode,uchar *pwd,size_t pwdlen,uchar *data,
                       size_t datalen,uchar *output)

{
  int iVar1;
  uchar *end_00;
  mbedtls_md_info_t *md_info_00;
  bool bVar2;
  undefined1 local_1b8 [8];
  mbedtls_cipher_context_t cipher_ctx;
  undefined1 local_158 [4];
  mbedtls_cipher_type_t cipher_alg;
  mbedtls_md_context_t md_ctx;
  mbedtls_cipher_info_t *cipher_info;
  mbedtls_md_info_t *md_info;
  size_t olen;
  uchar iv [32];
  uchar key [32];
  mbedtls_md_type_t local_dc;
  undefined1 local_d8 [4];
  mbedtls_md_type_t md_type;
  mbedtls_asn1_buf salt;
  mbedtls_asn1_buf enc_scheme_params;
  mbedtls_asn1_buf kdf_alg_params;
  mbedtls_asn1_buf enc_scheme_oid;
  mbedtls_asn1_buf kdf_alg_oid;
  uchar *end;
  uchar *p;
  uint local_48;
  int keylen;
  int iterations;
  int ret;
  size_t datalen_local;
  uchar *data_local;
  size_t pwdlen_local;
  uchar *pwd_local;
  mbedtls_asn1_buf *pmStack_18;
  int mode_local;
  mbedtls_asn1_buf *pbe_params_local;
  
  local_48 = 0;
  p._4_4_ = 0;
  local_dc = MBEDTLS_MD_SHA1;
  md_info = (mbedtls_md_info_t *)0x0;
  end = pbe_params->p;
  end_00 = end + pbe_params->len;
  if (pbe_params->tag == 0x30) {
    _iterations = datalen;
    datalen_local = (size_t)data;
    data_local = (uchar *)pwdlen;
    pwdlen_local = (size_t)pwd;
    pwd_local._4_4_ = mode;
    pmStack_18 = pbe_params;
    keylen = mbedtls_asn1_get_alg
                       (&end,end_00,(mbedtls_asn1_buf *)&enc_scheme_oid.p,
                        (mbedtls_asn1_buf *)&enc_scheme_params.p);
    if (keylen == 0) {
      bVar2 = true;
      if (kdf_alg_oid._0_8_ == 9) {
        iVar1 = memcmp(anon_var_dwarf_d18d,(void *)kdf_alg_oid.len,9);
        bVar2 = iVar1 != 0;
      }
      if (bVar2) {
        pbe_params_local._4_4_ = -0x2e80;
      }
      else {
        keylen = pkcs5_parse_pbkdf2_params
                           ((mbedtls_asn1_buf *)&enc_scheme_params.p,(mbedtls_asn1_buf *)local_d8,
                            (int *)&local_48,(int *)((long)&p + 4),&local_dc);
        pbe_params_local._4_4_ = keylen;
        if (keylen == 0) {
          md_info_00 = mbedtls_md_info_from_type(local_dc);
          if (md_info_00 == (mbedtls_md_info_t *)0x0) {
            pbe_params_local._4_4_ = -0x2e80;
          }
          else {
            keylen = mbedtls_asn1_get_alg
                               (&end,end_00,(mbedtls_asn1_buf *)&kdf_alg_params.p,
                                (mbedtls_asn1_buf *)&salt.p);
            if (keylen == 0) {
              iVar1 = mbedtls_oid_get_cipher_alg
                                ((mbedtls_asn1_buf *)&kdf_alg_params.p,
                                 (mbedtls_cipher_type_t *)((long)&cipher_ctx.cipher_ctx + 4));
              if (iVar1 == 0) {
                md_ctx.hmac_ctx = mbedtls_cipher_info_from_type(cipher_ctx.cipher_ctx._4_4_);
                if ((mbedtls_cipher_info_t *)md_ctx.hmac_ctx == (mbedtls_cipher_info_t *)0x0) {
                  pbe_params_local._4_4_ = -0x2e80;
                }
                else {
                  p._4_4_ = ((mbedtls_cipher_info_t *)md_ctx.hmac_ctx)->key_bitlen >> 3;
                  if (((int)salt.p == 4) &&
                     (enc_scheme_params._0_8_ ==
                      (ulong)((mbedtls_cipher_info_t *)md_ctx.hmac_ctx)->iv_size)) {
                    mbedtls_md_init((mbedtls_md_context_t *)local_158);
                    mbedtls_cipher_init((mbedtls_cipher_context_t *)local_1b8);
                    memcpy(&olen,(void *)enc_scheme_params.len,enc_scheme_params._0_8_);
                    keylen = mbedtls_md_setup((mbedtls_md_context_t *)local_158,md_info_00,1);
                    if ((((keylen == 0) &&
                         (keylen = mbedtls_pkcs5_pbkdf2_hmac
                                             ((mbedtls_md_context_t *)local_158,
                                              (uchar *)pwdlen_local,(size_t)data_local,
                                              (uchar *)salt.len,salt._0_8_,local_48,p._4_4_,
                                              iv + 0x18), keylen == 0)) &&
                        (keylen = mbedtls_cipher_setup
                                            ((mbedtls_cipher_context_t *)local_1b8,
                                             (mbedtls_cipher_info_t *)md_ctx.hmac_ctx), keylen == 0)
                        ) && ((keylen = mbedtls_cipher_setkey
                                                  ((mbedtls_cipher_context_t *)local_1b8,iv + 0x18,
                                                   p._4_4_ << 3,pwd_local._4_4_), keylen == 0 &&
                              (keylen = mbedtls_cipher_crypt
                                                  ((mbedtls_cipher_context_t *)local_1b8,
                                                   (uchar *)&olen,enc_scheme_params._0_8_,
                                                   (uchar *)datalen_local,_iterations,output,
                                                   (size_t *)&md_info), keylen != 0)))) {
                      keylen = -0x2e00;
                    }
                    mbedtls_md_free((mbedtls_md_context_t *)local_158);
                    mbedtls_cipher_free((mbedtls_cipher_context_t *)local_1b8);
                    pbe_params_local._4_4_ = keylen;
                  }
                  else {
                    pbe_params_local._4_4_ = -0x2f00;
                  }
                }
              }
              else {
                pbe_params_local._4_4_ = -0x2e80;
              }
            }
            else {
              pbe_params_local._4_4_ = keylen + -0x2f00;
            }
          }
        }
      }
    }
    else {
      pbe_params_local._4_4_ = keylen + -0x2f00;
    }
  }
  else {
    pbe_params_local._4_4_ = -0x2f62;
  }
  return pbe_params_local._4_4_;
}

Assistant:

int mbedtls_pkcs5_pbes2( const mbedtls_asn1_buf *pbe_params, int mode,
                 const unsigned char *pwd,  size_t pwdlen,
                 const unsigned char *data, size_t datalen,
                 unsigned char *output )
{
    int ret, iterations = 0, keylen = 0;
    unsigned char *p, *end;
    mbedtls_asn1_buf kdf_alg_oid, enc_scheme_oid, kdf_alg_params, enc_scheme_params;
    mbedtls_asn1_buf salt;
    mbedtls_md_type_t md_type = MBEDTLS_MD_SHA1;
    unsigned char key[32], iv[32];
    size_t olen = 0;
    const mbedtls_md_info_t *md_info;
    const mbedtls_cipher_info_t *cipher_info;
    mbedtls_md_context_t md_ctx;
    mbedtls_cipher_type_t cipher_alg;
    mbedtls_cipher_context_t cipher_ctx;

    p = pbe_params->p;
    end = p + pbe_params->len;

    /*
     *  PBES2-params ::= SEQUENCE {
     *    keyDerivationFunc AlgorithmIdentifier {{PBES2-KDFs}},
     *    encryptionScheme AlgorithmIdentifier {{PBES2-Encs}}
     *  }
     */
    if( pbe_params->tag != ( MBEDTLS_ASN1_CONSTRUCTED | MBEDTLS_ASN1_SEQUENCE ) )
        return( MBEDTLS_ERR_PKCS5_INVALID_FORMAT +
                MBEDTLS_ERR_ASN1_UNEXPECTED_TAG );

    if( ( ret = mbedtls_asn1_get_alg( &p, end, &kdf_alg_oid, &kdf_alg_params ) ) != 0 )
        return( MBEDTLS_ERR_PKCS5_INVALID_FORMAT + ret );

    // Only PBKDF2 supported at the moment
    //
    if( MBEDTLS_OID_CMP( MBEDTLS_OID_PKCS5_PBKDF2, &kdf_alg_oid ) != 0 )
        return( MBEDTLS_ERR_PKCS5_FEATURE_UNAVAILABLE );

    if( ( ret = pkcs5_parse_pbkdf2_params( &kdf_alg_params,
                                           &salt, &iterations, &keylen,
                                           &md_type ) ) != 0 )
    {
        return( ret );
    }

    md_info = mbedtls_md_info_from_type( md_type );
    if( md_info == NULL )
        return( MBEDTLS_ERR_PKCS5_FEATURE_UNAVAILABLE );

    if( ( ret = mbedtls_asn1_get_alg( &p, end, &enc_scheme_oid,
                              &enc_scheme_params ) ) != 0 )
    {
        return( MBEDTLS_ERR_PKCS5_INVALID_FORMAT + ret );
    }

    if( mbedtls_oid_get_cipher_alg( &enc_scheme_oid, &cipher_alg ) != 0 )
        return( MBEDTLS_ERR_PKCS5_FEATURE_UNAVAILABLE );

    cipher_info = mbedtls_cipher_info_from_type( cipher_alg );
    if( cipher_info == NULL )
        return( MBEDTLS_ERR_PKCS5_FEATURE_UNAVAILABLE );

    /*
     * The value of keylen from pkcs5_parse_pbkdf2_params() is ignored
     * since it is optional and we don't know if it was set or not
     */
    keylen = cipher_info->key_bitlen / 8;

    if( enc_scheme_params.tag != MBEDTLS_ASN1_OCTET_STRING ||
        enc_scheme_params.len != cipher_info->iv_size )
    {
        return( MBEDTLS_ERR_PKCS5_INVALID_FORMAT );
    }

    mbedtls_md_init( &md_ctx );
    mbedtls_cipher_init( &cipher_ctx );

    memcpy( iv, enc_scheme_params.p, enc_scheme_params.len );

    if( ( ret = mbedtls_md_setup( &md_ctx, md_info, 1 ) ) != 0 )
        goto exit;

    if( ( ret = mbedtls_pkcs5_pbkdf2_hmac( &md_ctx, pwd, pwdlen, salt.p, salt.len,
                                   iterations, keylen, key ) ) != 0 )
    {
        goto exit;
    }

    if( ( ret = mbedtls_cipher_setup( &cipher_ctx, cipher_info ) ) != 0 )
        goto exit;

    if( ( ret = mbedtls_cipher_setkey( &cipher_ctx, key, 8 * keylen, (mbedtls_operation_t) mode ) ) != 0 )
        goto exit;

    if( ( ret = mbedtls_cipher_crypt( &cipher_ctx, iv, enc_scheme_params.len,
                              data, datalen, output, &olen ) ) != 0 )
        ret = MBEDTLS_ERR_PKCS5_PASSWORD_MISMATCH;

exit:
    mbedtls_md_free( &md_ctx );
    mbedtls_cipher_free( &cipher_ctx );

    return( ret );
}